

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::runInLoop(EventLoop *this,Functor *cb)

{
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  bVar2 = isInLoopThread(this);
  if (bVar2) {
    std::function<void_()>::operator()(cb);
    return;
  }
  local_28 = (_Manager_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  queueInLoop(this,(Functor *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void EventLoop::runInLoop(Functor cb)
{
	// 如果是当前IO线程调用runInLoop，则同步调用cb
	if (isInLoopThread())
	{
		cb();
	}
	// 如果是其它线程调用runInLoop，则异步地将cb添加到队列
	else
	{
		queueInLoop(std::move(cb));
	}
}